

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t varint_length_from_bytes(uchar *bytes)

{
  size_t sVar1;
  
  sVar1 = 1;
  if (0xfffffffffffffffc < (ulong)(long)(char)*bytes) {
    sVar1 = *(size_t *)(&DAT_00155838 + (long)(char)*bytes * 8);
  }
  return sVar1;
}

Assistant:

size_t varint_length_from_bytes(const unsigned char *bytes)
{
    switch (*bytes) {
    case VI_TAG_16:
        return sizeof(uint8_t) + sizeof(uint16_t);
    case VI_TAG_32:
        return sizeof(uint8_t) + sizeof(uint32_t);
    case VI_TAG_64:
        return sizeof(uint8_t) + sizeof(uint64_t);
    }
    return sizeof(uint8_t);
}